

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeF32Const
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,float c)

{
  _Variant_storage<false,_wasm::Ok,_wasm::Err> local_60;
  anon_union_16_6_1532cd5a_for_Literal_0 local_38;
  undefined8 local_28;
  
  local_28 = 4;
  local_38.i32 = (int32_t)c;
  IRBuilder::makeConst((Result<wasm::Ok> *)&local_60,&this->irBuilder,(Literal *)&local_38.func);
  withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,(Result<wasm::Ok> *)&local_60);
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            (&local_60);
  Literal::~Literal((Literal *)&local_38.func);
  return __return_storage_ptr__;
}

Assistant:

Result<>
  makeF32Const(Index pos, const std::vector<Annotation>& annotations, float c) {
    return withLoc(pos, irBuilder.makeConst(Literal(c)));
  }